

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

void expiry_cb(lws_sorted_usec_list_t *sul)

{
  lws_dll2_owner **cache;
  lws_dll2_owner *e;
  int iVar1;
  
  cache = &sul[-2].list.owner;
  iVar1 = nsc_regen((lws_cache_nscookiejar_t *)cache,(char *)0x0,(void *)0x0,0);
  if ((iVar1 == 0) && (e = sul[1].list.owner, e != (lws_dll2_owner *)0x0)) {
    lws_cache_schedule((lws_cache_ttl_lru *)cache,expiry_cb,(lws_usec_t)e);
    return;
  }
  return;
}

Assistant:

static void
expiry_cb(lws_sorted_usec_list_t *sul)
{
	lws_cache_nscookiejar_t *cache = lws_container_of(sul,
					lws_cache_nscookiejar_t, cache.sul);

	/*
	 * regen the cookie jar without changes, so expired are removed and
	 * new earliest expired computed
	 */
	if (nsc_regen(cache, NULL, NULL, 0))
		return;

	if (cache->earliest_expiry)
		lws_cache_schedule(&cache->cache, expiry_cb,
				   cache->earliest_expiry);
}